

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void duckdb::MergeUpdateInfo<float>(UpdateInfo *current,float *result_data)

{
  uint uVar1;
  void *__src;
  idx_t i;
  ulong uVar2;
  
  uVar1 = current->N;
  __src = (void *)((long)&current[1].segment + (ulong)current->max * 4);
  if ((ulong)uVar1 == 0x800) {
    switchD_00916250::default(result_data,__src,0x2000);
    return;
  }
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    result_data[*(uint *)((long)&current[1].segment + uVar2 * 4)] =
         *(float *)((long)__src + uVar2 * 4);
  }
  return;
}

Assistant:

static void MergeUpdateInfo(UpdateInfo &current, T *result_data) {
	auto tuples = current.GetTuples();
	auto info_data = current.GetData<T>();
	if (current.N == STANDARD_VECTOR_SIZE) {
		// special case: update touches ALL tuples of this vector
		// in this case we can just memcpy the data
		// since the layout of the update info is guaranteed to be [0, 1, 2, 3, ...]
		memcpy(result_data, info_data, sizeof(T) * current.N);
	} else {
		for (idx_t i = 0; i < current.N; i++) {
			result_data[tuples[i]] = info_data[i];
		}
	}
}